

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-opcnt.cc
# Opt level: O0

Result __thiscall
wabt::(anonymous_namespace)::BinaryReaderOpcnt::Emplace<wabt::Opcode&,wabt::OpcodeInfo::Kind>
          (BinaryReaderOpcnt *this,Opcode *args,Kind *args_1)

{
  map<wabt::OpcodeInfo,unsigned_long,std::less<wabt::OpcodeInfo>,std::allocator<std::pair<wabt::OpcodeInfo_const,unsigned_long>>>
  *this_00;
  pointer ppVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>,_bool> pVar2;
  unsigned_long *count;
  tuple<int> local_44;
  tuple<wabt::Opcode,_wabt::OpcodeInfo::Kind> local_40;
  _Rb_tree_iterator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_> local_38;
  pair<std::_Rb_tree_iterator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>,_bool> pair;
  Kind *args_local_1;
  Opcode *args_local;
  BinaryReaderOpcnt *this_local;
  
  this_00 = *(map<wabt::OpcodeInfo,unsigned_long,std::less<wabt::OpcodeInfo>,std::allocator<std::pair<wabt::OpcodeInfo_const,unsigned_long>>>
              **)(this + 0x10);
  pair._8_8_ = args_1;
  std::make_tuple<wabt::Opcode&,wabt::OpcodeInfo::Kind>((Opcode *)&local_40,&args->enum_);
  std::make_tuple<int>((int *)&local_44);
  pVar2 = std::
          map<wabt::OpcodeInfo,unsigned_long,std::less<wabt::OpcodeInfo>,std::allocator<std::pair<wabt::OpcodeInfo_const,unsigned_long>>>
          ::
          emplace<std::piecewise_construct_t_const&,std::tuple<wabt::Opcode,wabt::OpcodeInfo::Kind>,std::tuple<int>>
                    (this_00,(piecewise_construct_t *)&std::piecewise_construct,&local_40,&local_44)
  ;
  local_38 = pVar2.first._M_node;
  pair.first._M_node._0_1_ = pVar2.second;
  ppVar1 = std::_Rb_tree_iterator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>::operator->
                     (&local_38);
  ppVar1->second = ppVar1->second + 1;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderOpcnt::Emplace(Args&&... args) {
  auto pair = opcode_counts_->emplace(
      std::piecewise_construct, std::make_tuple(std::forward<Args>(args)...),
      std::make_tuple(0));

  auto& count = pair.first->second;
  count++;
  return Result::Ok;
}